

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

int __thiscall draco::RAnsEncoder<12>::write_end(RAnsEncoder<12> *this)

{
  uint32_t val;
  uint uVar1;
  long *in_RDI;
  uint32_t state;
  int local_4;
  
  val = *(uint32_t *)((long)in_RDI + 0xc);
  uVar1 = val - 0x4000;
  if (uVar1 < 0x40) {
    *(char *)(*in_RDI + (long)(int)in_RDI[1]) = (char)uVar1;
    local_4 = (int)in_RDI[1] + 1;
  }
  else if (uVar1 < 0x4000) {
    mem_put_le16((void *)(*in_RDI + (long)(int)in_RDI[1]),val);
    local_4 = (int)in_RDI[1] + 2;
  }
  else if (uVar1 < 0x400000) {
    mem_put_le24((void *)(*in_RDI + (long)(int)in_RDI[1]),val + 0x7fc000);
    local_4 = (int)in_RDI[1] + 3;
  }
  else if (uVar1 < 0x40000000) {
    mem_put_le32((void *)(*in_RDI + (long)(int)in_RDI[1]),val + 0xbfffc000);
    local_4 = (int)in_RDI[1] + 4;
  }
  else {
    local_4 = (int)in_RDI[1];
  }
  return local_4;
}

Assistant:

inline int write_end() {
    uint32_t state;
    DRACO_DCHECK_GE(ans_.state, l_rans_base);
    DRACO_DCHECK_LT(ans_.state, l_rans_base * DRACO_ANS_IO_BASE);
    state = ans_.state - l_rans_base;
    if (state < (1 << 6)) {
      ans_.buf[ans_.buf_offset] = (0x00 << 6) + state;
      return ans_.buf_offset + 1;
    } else if (state < (1 << 14)) {
      mem_put_le16(ans_.buf + ans_.buf_offset, (0x01 << 14) + state);
      return ans_.buf_offset + 2;
    } else if (state < (1 << 22)) {
      mem_put_le24(ans_.buf + ans_.buf_offset, (0x02 << 22) + state);
      return ans_.buf_offset + 3;
    } else if (state < (1 << 30)) {
      mem_put_le32(ans_.buf + ans_.buf_offset, (0x03u << 30u) + state);
      return ans_.buf_offset + 4;
    } else {
      DRACO_DCHECK(0 && "State is too large to be serialized");
      return ans_.buf_offset;
    }
  }